

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3ts2cb_io.c
# Opt level: O3

int s3ts2cb_read(char *fn,uint32 **out_ts2cb,uint32 *out_n_ts,uint32 *out_n_cb)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 *puVar3;
  bool bVar4;
  int iVar5;
  void *ptr;
  long lVar6;
  size_t sVar7;
  
  iVar5 = s3map_read(fn,out_ts2cb,out_n_ts,out_n_cb,4);
  if (iVar5 == 0) {
    uVar1 = *out_n_ts;
    uVar2 = *out_n_cb;
    puVar3 = *out_ts2cb;
    ptr = __ckd_calloc__((long)(int)uVar2,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3ts2cb_io.c"
                         ,0x4a);
    if (0 < (long)(int)uVar1) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)ptr + (ulong)puVar3[lVar6] * 4) = 1;
        lVar6 = lVar6 + 1;
      } while ((int)uVar1 != lVar6);
    }
    if (0 < (int)uVar2) {
      sVar7 = 0;
      bVar4 = false;
      do {
        if (*(int *)((long)ptr + sVar7 * 4) == 0) {
          bVar4 = true;
        }
        sVar7 = sVar7 + 1;
      } while ((long)(int)uVar2 != sVar7);
      if (bVar4) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3ts2cb_io.c"
                ,0x56,"%s maps into [0..%u] rather than onto it\n",fn,(ulong)(uVar2 - 1));
      }
    }
    ckd_free(ptr);
  }
  return iVar5;
}

Assistant:

int
s3ts2cb_read(const char *fn,
	     uint32 **out_ts2cb,
	     uint32 *out_n_ts,
	     uint32 *out_n_cb)
{
    int ret, i, n_d, n_r;
    int *did_map, incomplete;
    uint32 *ts2cb;
    
    ret = s3map_read(fn,
		     (void **)out_ts2cb,
		     out_n_ts,
		     out_n_cb,
		     sizeof(uint32));

    if (ret == S3_SUCCESS) {
	n_d = *out_n_ts;
	n_r = *out_n_cb;
	ts2cb = *out_ts2cb;

	did_map = ckd_calloc(n_r, sizeof(int));

	for (i = 0; i < n_d; i++) {
	    did_map[ts2cb[i]] = TRUE;
	}
	
	for (i = 0, incomplete = FALSE; i < n_r; i++) {
	    if (!did_map[i])
		incomplete = TRUE;
	}
	if (incomplete) {
	    E_WARN("%s maps into [0..%u] rather than onto it\n",
		   fn, n_r-1);
	}

	ckd_free(did_map);
    }

    return ret;
}